

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

HRESULT __thiscall
Js::ScriptContext::OnDebuggerAttachedDetached
          (ScriptContext *this,bool attach,NativeCodeGenerator **previousCodeGenHolder)

{
  ThreadContext *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *this_01;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar2;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_> *pSVar3;
  FunctionBody *pFVar4;
  SListNodeBase<Memory::Recycler> addr;
  code *pcVar5;
  HRESULT HVar6;
  Type TVar7;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar8;
  undefined4 *puVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  this_00 = this->threadContext;
  this_00->debugManager->isDebuggerAttaching = true;
  ThreadContext::InvalidateAllProtoInlineCaches(this_00);
  ThreadContext::InvalidateAllStoreFieldInlineCaches(this->threadContext);
  ThreadContext::InvalidateAllIsInstInlineCaches(this->threadContext);
  if (!attach) {
    UnRegisterDebugThunk(this);
    GetDebugContext(this);
  }
  if (DAT_0159ef87 != '\0') {
    GetDebugContext(this);
  }
  HVar6 = RecreateNativeCodeGenerator(this,previousCodeGenHolder);
  if (-1 < HVar6) {
    if (attach) {
      GetDebugContext(this);
    }
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_OutOfMemory);
    pLVar8 = Memory::
             RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->sourceList);
    if ((pLVar8->
        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
        ).count < 1) {
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
    }
    else {
      lVar12 = 0;
      do {
        pRVar1 = (pLVar8->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar12].ptr;
        if ((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
           && (this_01 = (Utf8SourceInfo *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
              this_01 != (Utf8SourceInfo *)0x0)) {
          if ((this_01->field_0xa8 & 4) == 0) {
            Utf8SourceInfo::SetInDebugMode(this_01,attach);
            pSVar2 = (this_01->functionBodyDictionary).ptr;
            if ((pSVar2 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                            *)0x0) &&
               (TVar7 = (pSVar2->
                        super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ).bucketCount, TVar7 != 0)) {
              uVar10 = 0;
              do {
                iVar11 = (pSVar2->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).buckets.ptr[uVar10];
                if (iVar11 != -1) {
                  do {
                    pSVar3 = (pSVar2->
                             super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             ).entries.ptr;
                    pFVar4 = pSVar3[iVar11].
                             super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                             .
                             super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .value.ptr;
                    if (pFVar4 == (FunctionBody *)0x0) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                      *puVar9 = 1;
                      Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                          ,0xa2,"(functionBody)","functionBody");
LAB_0078d33a:
                      pcVar5 = (code *)invalidInstructionException();
                      (*pcVar5)();
                    }
                    iVar11 = pSVar3[iVar11].
                             super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                             .
                             super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .next;
                    FunctionBody::SetEntryToDeferParseForDebugger(pFVar4);
                  } while (iVar11 != -1);
                  TVar7 = (pSVar2->
                          super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          ).bucketCount;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 < TVar7);
            }
          }
          else {
            pSVar2 = (this_01->functionBodyDictionary).ptr;
            if ((pSVar2 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                            *)0x0) &&
               (TVar7 = (pSVar2->
                        super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ).bucketCount, TVar7 != 0)) {
              uVar10 = 0;
              do {
                iVar11 = (pSVar2->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).buckets.ptr[uVar10];
                if (iVar11 != -1) {
                  do {
                    pSVar3 = (pSVar2->
                             super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             ).entries.ptr;
                    pFVar4 = pSVar3[iVar11].
                             super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                             .
                             super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .value.ptr;
                    if (pFVar4 == (FunctionBody *)0x0) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                      *puVar9 = 1;
                      Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                          ,0xa2,"(functionBody)","functionBody");
                      goto LAB_0078d33a;
                    }
                    iVar11 = pSVar3[iVar11].
                             super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                             .
                             super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                             .next;
                    FunctionBody::ResetEntryPoint(pFVar4);
                  } while (iVar11 != -1);
                  TVar7 = (pSVar2->
                          super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          ).bucketCount;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 < TVar7);
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (pLVar8->
                        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                        ).count);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
    }
    if (attach) {
      RegisterDebugThunk(this,true);
    }
    addr.next.ptr =
         (Type)(((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
    HVar6 = 0;
    if (addr.next.ptr != (SListNodeBase<Memory::Recycler> *)0x0) {
      Memory::Recycler::WBSetBit((char *)addr.next.ptr);
      *(Type *)addr.next.ptr = addr.next.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)addr.next.ptr);
      *(undefined4 *)((long)addr.next.ptr + 8) = 0;
    }
  }
  this_00->debugManager->isDebuggerAttaching = false;
  return HVar6;
}

Assistant:

HRESULT ScriptContext::OnDebuggerAttachedDetached(bool attach)
#endif
    {

        // notify threadContext that debugger is attaching so do not do expire
        struct AutoRestore
        {
            AutoRestore(ThreadContext* threadContext)
                :threadContext(threadContext)
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(true);
            }
            ~AutoRestore()
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(false);
            }

        private:
            ThreadContext* threadContext;

        } autoRestore(this->GetThreadContext());

        // Invalidate all the caches.
        this->threadContext->InvalidateAllProtoInlineCaches();
        this->threadContext->InvalidateAllStoreFieldInlineCaches();
        this->threadContext->InvalidateAllIsInstInlineCaches();

        if (!attach)
        {
            this->UnRegisterDebugThunk();

            // Remove all breakpoint probes
            this->GetDebugContext()->GetProbeContainer()->RemoveAllProbes();
        }

        HRESULT hr = S_OK;

        if (!CONFIG_FLAG(ForceDiagnosticsMode))
        {
#if ENABLE_NATIVE_CODEGEN
            // Recreate the native code generator so that all pending
            // JIT work items will be cleared.
            hr = RecreateNativeCodeGenerator(previousCodeGenHolder);
            if (FAILED(hr))
            {
                return hr;
            }
#endif
            if (attach)
            {
                // We need to transition to debug mode after the NativeCodeGenerator is cleared/closed. Since the NativeCodeGenerator will be working on a different thread - it may
                // be checking on the DebuggerState (from ScriptContext) while emitting code.
                this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
#if ENABLE_NATIVE_CODEGEN
                UpdateNativeCodeGeneratorForDebugMode(this->nativeCodeGen);
#endif
            }
        }
        else if (attach)
        {
            this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
        }

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // Remap all the function entry point thunks.
            this->sourceList->Map([=](uint i, RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef) {
                Js::Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();

                if (sourceInfo != nullptr)
                {
                    if (!sourceInfo->GetIsLibraryCode())
                    {
                        sourceInfo->SetInDebugMode(attach);

                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->SetEntryToDeferParseForDebugger();
                        });
                    }
                    else
                    {
                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->ResetEntryPoint();
                        });
                    }
                }
            });
        }